

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O0

void cjson_replace_item_in_object_should_preserve_name(void)

{
  long lVar1;
  cJSON *item;
  cJSON *newitem;
  long in_FS_OFFSET;
  cJSON *replacement;
  cJSON *child;
  cJSON root [1];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&child,0,0x40);
  item = cJSON_CreateNumber(1.0);
  if (item == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x13a);
  }
  newitem = cJSON_CreateNumber(2.0);
  if (newitem == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x13c);
  }
  cJSON_AddItemToObject((cJSON *)&child,"child",item);
  cJSON_ReplaceItemInObject((cJSON *)&child,"child",newitem);
  if (root[0].prev != newitem) {
    UnityFail(" Expected TRUE Was FALSE",0x141);
  }
  UnityAssertEqualString("child",newitem->string,0,0x142);
  cJSON_Delete(newitem);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void cjson_replace_item_in_object_should_preserve_name(void)
{
    cJSON root[1] = {{ NULL, NULL, NULL, 0, NULL, 0, 0, NULL }};
    cJSON *child = NULL;
    cJSON *replacement = NULL;

    child = cJSON_CreateNumber(1);
    TEST_ASSERT_NOT_NULL(child);
    replacement = cJSON_CreateNumber(2);
    TEST_ASSERT_NOT_NULL(replacement);

    cJSON_AddItemToObject(root, "child", child);
    cJSON_ReplaceItemInObject(root, "child", replacement);

    TEST_ASSERT_TRUE(root->child == replacement);
    TEST_ASSERT_EQUAL_STRING("child", replacement->string);

    cJSON_Delete(replacement);
}